

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xml_allocator::deallocate_string(xml_allocator *this,char_t *string)

{
  char_t *ptr;
  
  ptr = string + -4;
  if (*(ushort *)(string + -2) != 0) {
    deallocate_memory(this,ptr,(ulong)*(ushort *)(string + -2) << 3,
                      (xml_memory_page *)(ptr + (ulong)*(ushort *)(string + -4) * -8 + -0x28));
    return;
  }
  deallocate_memory(this,ptr,*(size_t *)(ptr + (ulong)*(ushort *)(string + -4) * -8 + -0x10),
                    (xml_memory_page *)(ptr + (ulong)*(ushort *)(string + -4) * -8 + -0x28));
  return;
}

Assistant:

void deallocate_string(char_t* string)
		{
			// this function casts pointers through void* to avoid 'cast increases required alignment of target type' warnings
			// we're guaranteed the proper (pointer-sized) alignment on the input string if it was allocated via allocate_string

			// get header
			xml_memory_string_header* header = static_cast<xml_memory_string_header*>(static_cast<void*>(string)) - 1;
			assert(header);

			// deallocate
			size_t page_offset = sizeof(xml_memory_page) + header->page_offset * xml_memory_block_alignment;
			xml_memory_page* page = reinterpret_cast<xml_memory_page*>(static_cast<void*>(reinterpret_cast<char*>(header) - page_offset));

			// if full_size == 0 then this string occupies the whole page
			size_t full_size = header->full_size == 0 ? page->busy_size : header->full_size * xml_memory_block_alignment;

			deallocate_memory(header, full_size, page);
		}